

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::_abi_1_10::Formatter::formatNodeList
                (String *sb,FormatOptions *formatOptions,BaseBuilder *builder,BaseNode *begin,
                BaseNode *end)

{
  Error EVar1;
  BaseNode *in_RCX;
  BaseNode *in_R8;
  Error _err_1;
  Error _err;
  BaseNode *node;
  BaseNode *in_stack_000002e0;
  BaseBuilder *in_stack_000002e8;
  FormatOptions *in_stack_000002f0;
  String *in_stack_000002f8;
  char in_stack_ffffffffffffffbf;
  Error in_stack_ffffffffffffffc0;
  BaseNode *local_38;
  
  local_38 = in_RCX;
  while( true ) {
    if (local_38 == in_R8) {
      return 0;
    }
    EVar1 = formatNode(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
    if (EVar1 != 0) break;
    in_stack_ffffffffffffffc0 =
         String::append((String *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    if (in_stack_ffffffffffffffc0 != 0) {
      return in_stack_ffffffffffffffc0;
    }
    local_38 = BaseNode::next(local_38);
  }
  return EVar1;
}

Assistant:

Error formatNodeList(
  String& sb,
  const FormatOptions& formatOptions,
  const BaseBuilder* builder,
  const BaseNode* begin,
  const BaseNode* end) noexcept {

  const BaseNode* node = begin;
  while (node != end) {
    ASMJIT_PROPAGATE(formatNode(sb, formatOptions, builder, node));
    ASMJIT_PROPAGATE(sb.append('\n'));
    node = node->next();
  }
  return kErrorOk;
}